

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceInfo.hpp
# Opt level: O1

void __thiscall helics::InterfaceInfo::InterfaceInfo(InterfaceInfo *this)

{
  (this->global_id)._M_i.gid = -2010000000;
  this->only_update_on_change = false;
  memset(&this->publications,0,0x88);
  (this->publications).m_obj.lookup1._M_h._M_buckets =
       &(this->publications).m_obj.lookup1._M_h._M_single_bucket;
  (this->publications).m_obj.lookup1._M_h._M_bucket_count = 1;
  (this->publications).m_obj.lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->publications).m_obj.lookup1._M_h._M_element_count = 0;
  (this->publications).m_obj.lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->publications).m_obj.lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->publications).m_obj.lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->publications).m_obj.lookup2._M_h._M_buckets =
       &(this->publications).m_obj.lookup2._M_h._M_single_bucket;
  (this->publications).m_obj.lookup2._M_h._M_bucket_count = 1;
  (this->publications).m_obj.lookup2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->publications).m_obj.lookup2._M_h._M_element_count = 0;
  (this->publications).m_obj.lookup2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->publications).m_obj.lookup2._M_h._M_rehash_policy._M_next_resize,0,0xd0);
  (this->endpoints).m_obj.lookup1._M_h._M_buckets =
       &(this->endpoints).m_obj.lookup1._M_h._M_single_bucket;
  (this->endpoints).m_obj.lookup1._M_h._M_bucket_count = 1;
  (this->endpoints).m_obj.lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->endpoints).m_obj.lookup1._M_h._M_element_count = 0;
  (this->endpoints).m_obj.lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->endpoints).m_obj.lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->endpoints).m_obj.lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->endpoints).m_obj.lookup2._M_h._M_buckets =
       &(this->endpoints).m_obj.lookup2._M_h._M_single_bucket;
  (this->endpoints).m_obj.lookup2._M_h._M_bucket_count = 1;
  (this->endpoints).m_obj.lookup2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->endpoints).m_obj.lookup2._M_h._M_element_count = 0;
  (this->endpoints).m_obj.lookup2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  memset(&(this->endpoints).m_obj.lookup2._M_h._M_rehash_policy._M_next_resize,0,0xd0);
  (this->inputs).m_obj.lookup1._M_h._M_buckets = &(this->inputs).m_obj.lookup1._M_h._M_single_bucket
  ;
  (this->inputs).m_obj.lookup1._M_h._M_bucket_count = 1;
  (this->inputs).m_obj.lookup1._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputs).m_obj.lookup1._M_h._M_element_count = 0;
  (this->inputs).m_obj.lookup1._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputs).m_obj.lookup1._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputs).m_obj.lookup1._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->inputs).m_obj.lookup2._M_h._M_buckets = &(this->inputs).m_obj.lookup2._M_h._M_single_bucket
  ;
  (this->inputs).m_obj.lookup2._M_h._M_bucket_count = 1;
  (this->inputs).m_obj.lookup2._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->inputs).m_obj.lookup2._M_h._M_element_count = 0;
  (this->inputs).m_obj.lookup2._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->inputs).m_obj.lookup2._M_h._M_rehash_policy._M_next_resize = 0;
  (this->inputs).m_obj.lookup2._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->inputs).m_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->inputs).m_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->inputs).m_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->inputs).m_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->inputs).m_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->inputs).m_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->inputs).m_mutex._M_impl._M_rwlock + 0x30) = 0;
  return;
}

Assistant:

InterfaceInfo() = default;